

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

size_t __thiscall CASC_ARRAY::IndexOf(CASC_ARRAY *this,void *pItem)

{
  LPBYTE pBVar1;
  ulong uVar2;
  
  pBVar1 = this->m_pItemArray;
  if ((pBVar1 <= pItem) && (uVar2 = this->m_ItemSize, pItem <= pBVar1 + this->m_ItemCount * uVar2))
  {
    if ((ulong)((long)pItem - (long)pBVar1) % uVar2 == 0) {
      return (ulong)((long)pItem - (long)pBVar1) / uVar2;
    }
    __assert_fail("((pbItem - m_pItemArray) % m_ItemSize) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/../common/Array.h"
                  ,0x6a,"size_t CASC_ARRAY::IndexOf(const void *)");
  }
  __assert_fail("(m_pItemArray <= pbItem) && (pbItem <= m_pItemArray + (m_ItemCount * m_ItemSize))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/../common/Array.h"
                ,0x69,"size_t CASC_ARRAY::IndexOf(const void *)");
}

Assistant:

size_t IndexOf(const void * pItem)
    {
        LPBYTE pbItem = (LPBYTE)pItem;

        assert((m_pItemArray <= pbItem) && (pbItem <= m_pItemArray + (m_ItemCount * m_ItemSize)));
        assert(((pbItem - m_pItemArray) % m_ItemSize) == 0);

        return ((pbItem - m_pItemArray) / m_ItemSize);
    }